

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * cJSON_Duplicate(cJSON *item,cJSON_bool recurse)

{
  uchar *puVar1;
  cJSON *pcVar2;
  uchar *local_48;
  cJSON *newchild;
  cJSON *next;
  cJSON *child;
  cJSON *newitem;
  cJSON_bool recurse_local;
  cJSON *item_local;
  
  child = (cJSON *)0x0;
  newchild = (cJSON *)0x0;
  if ((item == (cJSON *)0x0) || (child = cJSON_New_Item(&global_hooks), child == (cJSON *)0x0)) {
LAB_0010600d:
    if (child != (cJSON *)0x0) {
      cJSON_Delete(child);
    }
    item_local = (cJSON *)0x0;
  }
  else {
    child->type = item->type & 0xfffffeff;
    child->valueint = item->valueint;
    child->valuedouble = item->valuedouble;
    if (item->valuestring != (char *)0x0) {
      puVar1 = cJSON_strdup((uchar *)item->valuestring,&global_hooks);
      child->valuestring = (char *)puVar1;
      if (child->valuestring == (char *)0x0) goto LAB_0010600d;
    }
    if (item->string != (char *)0x0) {
      if ((item->type & 0x200U) == 0) {
        local_48 = cJSON_strdup((uchar *)item->string,&global_hooks);
      }
      else {
        local_48 = (uchar *)item->string;
      }
      child->string = (char *)local_48;
      if (child->string == (char *)0x0) goto LAB_0010600d;
    }
    item_local = child;
    if (recurse != 0) {
      for (next = item->child; next != (cJSON *)0x0; next = next->next) {
        pcVar2 = cJSON_Duplicate(next,1);
        if (pcVar2 == (cJSON *)0x0) goto LAB_0010600d;
        if (newchild == (cJSON *)0x0) {
          child->child = pcVar2;
        }
        else {
          newchild->next = pcVar2;
          pcVar2->prev = newchild;
        }
        newchild = pcVar2;
      }
      if ((child != (cJSON *)0x0) && (child->child != (cJSON *)0x0)) {
        child->child->prev = newchild;
      }
    }
  }
  return item_local;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_Duplicate(const cJSON *item, cJSON_bool recurse)
{
    cJSON *newitem = NULL;
    cJSON *child = NULL;
    cJSON *next = NULL;
    cJSON *newchild = NULL;

    /* Bail on bad ptr */
    if (!item)
    {
        goto fail;
    }
    /* Create new item */
    newitem = cJSON_New_Item(&global_hooks);
    if (!newitem)
    {
        goto fail;
    }
    /* Copy over all vars */
    newitem->type = item->type & (~cJSON_IsReference);
    newitem->valueint = item->valueint;
    newitem->valuedouble = item->valuedouble;
    if (item->valuestring)
    {
        newitem->valuestring = (char*)cJSON_strdup((unsigned char*)item->valuestring, &global_hooks);
        if (!newitem->valuestring)
        {
            goto fail;
        }
    }
    if (item->string)
    {
        newitem->string = (item->type&cJSON_StringIsConst) ? item->string : (char*)cJSON_strdup((unsigned char*)item->string, &global_hooks);
        if (!newitem->string)
        {
            goto fail;
        }
    }
    /* If non-recursive, then we're done! */
    if (!recurse)
    {
        return newitem;
    }
    /* Walk the ->next chain for the child. */
    child = item->child;
    while (child != NULL)
    {
        newchild = cJSON_Duplicate(child, true); /* Duplicate (with recurse) each item in the ->next chain */
        if (!newchild)
        {
            goto fail;
        }
        if (next != NULL)
        {
            /* If newitem->child already set, then crosswire ->prev and ->next and move on */
            next->next = newchild;
            newchild->prev = next;
            next = newchild;
        }
        else
        {
            /* Set newitem->child and move to it */
            newitem->child = newchild;
            next = newchild;
        }
        child = child->next;
    }
    if (newitem && newitem->child)
    {
        newitem->child->prev = newchild;
    }

    return newitem;

fail:
    if (newitem != NULL)
    {
        cJSON_Delete(newitem);
    }

    return NULL;
}